

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SequentialPropsCmd.cpp
# Opt level: O1

int cmdline_parser_internal
              (int argc,char **argv,gengetopt_args_info *args_info,cmdline_parser_params *params,
              char *additional_error)

{
  custom_getopt_data *pcVar1;
  int check_ambiguity;
  bool bVar2;
  int iVar3;
  option *poVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  void *pvVar8;
  size_t sVar9;
  char **ppcVar10;
  uint *puVar11;
  char *pcVar12;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  undefined8 extraout_RDX_03;
  char *extraout_RDX_04;
  char *extraout_RDX_05;
  char *extraout_RDX_06;
  char *extraout_RDX_07;
  uint *puVar13;
  char *extraout_RDX_08;
  char *extraout_RDX_09;
  char *extraout_RDX_10;
  char *extraout_RDX_11;
  char *extraout_RDX_12;
  char *extraout_RDX_13;
  char *extraout_RDX_14;
  char *extraout_RDX_15;
  char *extraout_RDX_16;
  char *extraout_RDX_17;
  char cVar14;
  int iVar15;
  int iVar16;
  option *poVar17;
  char *pcVar18;
  double *field;
  long lVar19;
  size_t sVar20;
  custom_getopt_data *pcVar21;
  int iVar22;
  uint uVar23;
  ulong uVar24;
  char *__s1;
  bool bVar25;
  char *pcVar26;
  cmdline_parser_arg_type cVar27;
  char *in_stack_fffffffffffffb18;
  undefined4 in_stack_fffffffffffffb28;
  int in_stack_fffffffffffffb2c;
  int local_4a4;
  option *local_4a0;
  gengetopt_args_info local_args_info;
  
  package_name = *argv;
  uVar24 = (ulong)(uint)params->override;
  iVar7 = params->check_required;
  check_ambiguity = params->check_ambiguity;
  pcVar18 = (char *)argv;
  if (params->initialize != 0) {
    cmdline_parser_init(args_info);
  }
  cmdline_parser_init(&local_args_info);
  iVar15 = params->print_errors;
  pcVar21 = (custom_getopt_data *)0x0;
  iVar16 = 0;
  pcVar26 = extraout_RDX;
  do {
    custom_opterr = iVar15;
    _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = iVar16;
    if (argc < 1) {
      iVar22 = -1;
LAB_001262a2:
      local_4a4 = 0;
    }
    else {
      _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3 = (custom_getopt_data *)0x0;
      if ((iVar16 == 0) || ((_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_4 & 1) == 0)) {
        if (iVar16 == 0) {
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = 1;
        }
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7 =
             _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6 =
             _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 = (custom_getopt_data *)0x0;
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_4 = 1;
      }
      custom_optarg = (char *)pcVar21;
      if ((_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 == (custom_getopt_data *)0x0) ||
         (*(char *)&_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5->custom_optind == '\0')) {
        if (_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 <
            _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7) {
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7 =
               _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
        }
        if (_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 <
            _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6) {
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6 =
               _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
        }
        bVar25 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6 ==
                 _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7;
        pcVar26 = (char *)CONCAT71((int7)((ulong)pcVar26 >> 8),bVar25);
        pcVar18 = (char *)CONCAT71((int7)((ulong)pcVar18 >> 8),
                                   _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7 ==
                                   _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 || bVar25);
        if (_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7 ==
            _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 || bVar25) {
          if (_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7 !=
              _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0) {
            _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6 =
                 _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
          }
        }
        else {
          exchange(argv,(custom_getopt_data *)pcVar18);
          pcVar26 = extraout_RDX_00;
        }
        iVar16 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
        if (_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 < argc) {
          ppcVar10 = argv + _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
          do {
            if ((**ppcVar10 == '-') &&
               (iVar16 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0,
               (*ppcVar10)[1] != '\0')) break;
            _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 =
                 _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 + 1;
            ppcVar10 = ppcVar10 + 1;
            iVar16 = argc;
          } while (argc != _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0);
        }
        iVar22 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
        iVar6 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6;
        iVar3 = iVar16;
        if (iVar16 != argc) {
          pcVar18 = "--";
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7 = iVar16;
          iVar5 = strcmp(argv[iVar16],"--");
          pcVar26 = extraout_RDX_01;
          iVar22 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
          iVar6 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6;
          iVar3 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7;
          if ((iVar5 == 0) &&
             (_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = iVar16 + 1, iVar22 = argc,
             iVar6 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0, iVar3 = argc,
             _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6 != iVar16)) {
            exchange(argv,(custom_getopt_data *)pcVar18);
            pcVar26 = extraout_RDX_02;
            iVar22 = argc;
            iVar6 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6;
            iVar3 = argc;
          }
        }
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7 = iVar3;
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6 = iVar6;
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = iVar22;
        if (_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 == argc) {
          iVar22 = -1;
          if (_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6 !=
              _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7) {
            _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 =
                 _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6;
          }
LAB_00126013:
          bVar25 = false;
        }
        else {
          pcVar21 = (custom_getopt_data *)argv[_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0]
          ;
          if (*(char *)&pcVar21->custom_optind != '-') {
LAB_00125ffe:
            _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 =
                 _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 + 1;
            iVar22 = 1;
            _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3 = pcVar21;
            goto LAB_00126013;
          }
          cVar14 = *(char *)((long)&pcVar21->custom_optind + 1);
          pcVar26 = (char *)CONCAT71((int7)((ulong)pcVar26 >> 8),cVar14);
          if (cVar14 == '\0') goto LAB_00125ffe;
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 =
               (custom_getopt_data *)((long)&pcVar21->custom_optind + (ulong)(cVar14 == '-') + 1);
          iVar22 = 0;
          bVar25 = true;
        }
        local_4a4 = 0;
        if (bVar25) goto LAB_00126024;
      }
      else {
LAB_00126024:
        pcVar21 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5;
        iVar16 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
        lVar19 = (long)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
        pcVar12 = argv[lVar19];
        if (pcVar12[1] == '-') {
          for (sVar20 = 0;
              (cVar14 = *(char *)((long)&_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5->
                                         custom_optind + sVar20), cVar14 != '\0' && (cVar14 != '='))
              ; sVar20 = sVar20 + 1) {
          }
          local_4a4 = -1;
          iVar22 = 0;
          bVar25 = true;
          __s1 = "help";
          bVar2 = false;
          local_4a0 = (option *)0x0;
          poVar17 = cmdline_parser_internal::long_options;
          in_stack_fffffffffffffb2c = iVar15;
          do {
            pcVar18 = (char *)pcVar21;
            iVar6 = strncmp(__s1,(char *)pcVar21,sVar20);
            pcVar26 = extraout_RDX_04;
            iVar15 = local_4a4;
            poVar4 = local_4a0;
            if (iVar6 == 0) {
              sVar9 = strlen(__s1);
              pcVar26 = extraout_RDX_05;
              iVar15 = iVar22;
              poVar4 = poVar17;
              if ((int)sVar9 == (int)sVar20) break;
              if ((local_4a0 != (option *)0x0) &&
                 (((local_4a0->has_arg != poVar17->has_arg || (local_4a0->flag != poVar17->flag)) ||
                  (iVar15 = local_4a4, poVar4 = local_4a0, local_4a0->val != poVar17->val)))) {
                bVar2 = true;
                iVar15 = local_4a4;
                poVar4 = local_4a0;
              }
            }
            local_4a0 = poVar4;
            local_4a4 = iVar15;
            iVar22 = iVar22 + 1;
            __s1 = poVar17[1].name;
            poVar17 = poVar17 + 1;
            bVar25 = __s1 != (char *)0x0;
            iVar15 = local_4a4;
            poVar4 = local_4a0;
          } while (bVar25);
          local_4a0 = poVar4;
          local_4a4 = iVar15;
          if ((bool)(!bVar2 | bVar25)) {
            if (local_4a0 == (option *)0x0) {
              if (in_stack_fffffffffffffb2c != 0) {
                pcVar18 = "%s: unrecognized option `--%s\'\n";
                fprintf(_stderr,"%s: unrecognized option `--%s\'\n",*argv,pcVar21);
                pcVar26 = extraout_RDX_15;
              }
              _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 =
                   _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 + 1;
              _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 = (custom_getopt_data *)0x211119;
              iVar22 = 0x3f;
              goto LAB_001262a2;
            }
            _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = iVar16 + 1;
            if (*(char *)((long)&pcVar21->custom_optind + sVar20) == '\0') {
              if (local_4a0->has_arg == 1) {
                if (argc <= _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0) {
                  if (in_stack_fffffffffffffb2c != 0) {
                    pcVar26 = *argv;
                    pcVar18 = "%s: option `%s\' requires an argument\n";
                    goto LAB_00126c3d;
                  }
                  goto LAB_001269e7;
                }
                _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = iVar16 + 2;
                _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3 =
                     (custom_getopt_data *)argv[lVar19 + 1];
              }
            }
            else {
              if (local_4a0->has_arg == 0) {
                if (in_stack_fffffffffffffb2c != 0) {
                  pcVar26 = *argv;
                  if (pcVar12[1] == '-') {
                    pcVar12 = local_4a0->name;
                    pcVar18 = "%s: option `--%s\' doesn\'t allow an argument\n";
LAB_00126c3d:
                    fprintf(_stderr,pcVar18,pcVar26,pcVar12);
                  }
                  else {
                    pcVar18 = "%s: option `%c%s\' doesn\'t allow an argument\n";
                    fprintf(_stderr,"%s: option `%c%s\' doesn\'t allow an argument\n",pcVar26,
                            (ulong)(uint)(int)*pcVar12,local_4a0->name);
                  }
                }
LAB_001269e7:
                pcVar21 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5;
                sVar20 = strlen((char *)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5);
                pcVar26 = extraout_RDX_14;
                goto LAB_00126228;
              }
              _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3 =
                   (custom_getopt_data *)((long)&pcVar21->custom_optind + sVar20 + 1);
            }
            sVar20 = strlen((char *)pcVar21);
            _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 =
                 (custom_getopt_data *)((long)&pcVar21->custom_optind + sVar20);
            iVar22 = local_4a0->val;
            pcVar26 = extraout_RDX_10;
            if (local_4a0->flag != (int *)0x0) {
              *local_4a0->flag = iVar22;
              iVar22 = 0;
            }
            goto LAB_001262a4;
          }
          if (in_stack_fffffffffffffb2c != 0) {
            pcVar18 = "%s: option `%s\' is ambiguous\n";
            fprintf(_stderr,"%s: option `%s\' is ambiguous\n",*argv,pcVar12);
          }
          pcVar21 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5;
          sVar20 = strlen((char *)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5);
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 =
               _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 + 1;
          pcVar26 = extraout_RDX_06;
LAB_00126228:
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 =
               (custom_getopt_data *)((long)&pcVar21->custom_optind + sVar20);
        }
        else {
          pcVar1 = (custom_getopt_data *)
                   ((long)&_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5->custom_optind + 1);
          cVar14 = *(char *)&_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5->custom_optind;
          uVar23 = (uint)cVar14;
          pcVar18 = (char *)(ulong)uVar23;
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 = pcVar1;
          pvVar8 = memchr("hVi:o:b:x:y:z:r:cvt",uVar23,0x14);
          if (*(char *)((long)&pcVar21->custom_optind + 1) == '\0') {
            _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = iVar16 + 1;
          }
          pcVar26 = (char *)CONCAT71((int7)((ulong)extraout_RDX_03 >> 8),
                                     cVar14 == ':' || pvVar8 == (void *)0x0);
          if (cVar14 != ':' && pvVar8 != (void *)0x0) {
            if (*(char *)((long)pvVar8 + 1) == ':') {
              if (*(char *)((long)pvVar8 + 2) == ':') {
                if (*(char *)&pcVar1->custom_optind == '\0') {
                  _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3 = (custom_getopt_data *)0x0;
                }
                else {
LAB_0012627c:
                  _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 =
                       _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 + 1;
                  _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3 = pcVar1;
                }
              }
              else {
                if (*(char *)&pcVar1->custom_optind != '\0') goto LAB_0012627c;
                lVar19 = (long)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
                if (_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 == argc) {
                  cVar14 = '?';
                  if (iVar15 != 0) {
                    pcVar18 = "%s: option requires an argument -- %c\n";
                    fprintf(_stderr,"%s: option requires an argument -- %c\n",*argv,(ulong)uVar23);
                    pcVar26 = extraout_RDX_12;
                  }
                }
                else {
                  _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 =
                       _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 + 1;
                  _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3 =
                       (custom_getopt_data *)argv[lVar19];
                }
              }
              _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 = (custom_getopt_data *)0x0;
            }
            iVar22 = (int)cVar14;
            goto LAB_001262a2;
          }
          if (iVar15 != 0) {
            pcVar18 = "%s: invalid option -- %c\n";
            fprintf(_stderr,"%s: invalid option -- %c\n",*argv,(ulong)uVar23);
            pcVar26 = extraout_RDX_13;
          }
        }
        local_4a4 = 0;
        iVar22 = 0x3f;
      }
    }
LAB_001262a4:
    pcVar21 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3;
    iVar16 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
    iVar15 = custom_opterr;
    custom_optarg = (char *)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3;
    if (iVar22 < 0x56) {
      if (iVar22 != -1) {
        if (iVar22 != 0) {
          if (iVar22 != 0x3f) break;
          iVar22 = 5;
          goto LAB_00126783;
        }
        pcVar26 = cmdline_parser_internal::long_options[local_4a4].name;
        iVar22 = strcmp(pcVar26,"sele1");
        if (iVar22 == 0) {
          pcVar18 = (char *)&args_info->sele1_orig;
          iVar6 = update_arg(&args_info->sele1_arg,&args_info->sele1_orig,&args_info->sele1_given,
                             &local_args_info.sele1_given,(char *)pcVar21,(char **)0x0,(char *)0x0,
                             ARG_STRING,check_ambiguity,(int)uVar24,0x2082fb,0x2d,
                             in_stack_fffffffffffffb18,(char)uVar24,
                             (char *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28));
          pcVar26 = extraout_RDX_09;
joined_r0x00126881:
          iVar22 = 5;
          if (iVar6 != 0) goto LAB_00126783;
        }
        else {
          iVar22 = strcmp(pcVar26,"sele2");
          if (iVar22 == 0) {
            pcVar18 = (char *)&args_info->sele2_orig;
            iVar6 = update_arg(&args_info->sele2_arg,&args_info->sele2_orig,&args_info->sele2_given,
                               &local_args_info.sele2_given,(char *)pcVar21,(char **)0x0,(char *)0x0
                               ,ARG_STRING,check_ambiguity,(int)uVar24,0x208301,0x2d,
                               in_stack_fffffffffffffb18,(char)uVar24,
                               (char *)CONCAT44(iVar15,in_stack_fffffffffffffb28));
            pcVar26 = extraout_RDX_11;
            in_stack_fffffffffffffb2c = iVar15;
            goto joined_r0x00126881;
          }
          iVar22 = strcmp(pcVar26,"nbins_z");
          if (iVar22 == 0) {
            ppcVar10 = (char **)0x0;
            iVar22 = 0x20830d;
            cVar27 = ARG_INT;
            pcVar26 = "100";
            puVar11 = &local_args_info.nbins_z_given;
            puVar13 = &args_info->nbins_z_given;
            pcVar18 = (char *)&args_info->nbins_z_orig;
            field = (double *)&args_info->nbins_z_arg;
LAB_00126aba:
            iVar6 = update_arg(field,(char **)pcVar18,puVar13,puVar11,(char *)pcVar21,ppcVar10,
                               pcVar26,cVar27,check_ambiguity,(int)uVar24,iVar22,0x2d,
                               in_stack_fffffffffffffb18,(char)uVar24,
                               (char *)CONCAT44(iVar15,in_stack_fffffffffffffb28));
            pcVar26 = extraout_RDX_16;
            in_stack_fffffffffffffb2c = iVar15;
            goto joined_r0x00126881;
          }
          iVar22 = strcmp(pcVar26,"privilegedAxis");
          if (iVar22 == 0) {
            ppcVar10 = cmdline_parser_privilegedAxis_values;
            iVar22 = 0x208315;
            cVar27 = ARG_ENUM;
            pcVar26 = "z";
            puVar11 = &local_args_info.privilegedAxis_given;
            puVar13 = &args_info->privilegedAxis_given;
            pcVar18 = (char *)&args_info->privilegedAxis_orig;
            field = (double *)&args_info->privilegedAxis_arg;
            goto LAB_00126aba;
          }
          iVar22 = 0x20834c;
          iVar6 = strcmp(pcVar26,"threshDens");
          puVar11 = &local_args_info.threshDens_given;
          puVar13 = &args_info->threshDens_given;
          pcVar18 = (char *)&args_info->threshDens_orig;
          field = &args_info->threshDens_arg;
          if (iVar6 == 0) {
LAB_00126aa5:
            ppcVar10 = (char **)0x0;
            cVar27 = ARG_DOUBLE;
            pcVar26 = (char *)0x0;
            goto LAB_00126aba;
          }
          iVar22 = 0x208357;
          iVar6 = strcmp(pcVar26,"bufferLength");
          puVar11 = &local_args_info.bufferLength_given;
          puVar13 = &args_info->bufferLength_given;
          pcVar18 = (char *)&args_info->bufferLength_orig;
          field = &args_info->bufferLength_arg;
          if (iVar6 == 0) goto LAB_00126aa5;
          iVar22 = 0x208364;
          iVar6 = strcmp(pcVar26,"rcut");
          puVar11 = &local_args_info.rcut_given;
          puVar13 = &args_info->rcut_given;
          pcVar18 = (char *)&args_info->rcut_orig;
          field = &args_info->rcut_arg;
          if (iVar6 == 0) goto LAB_00126aa5;
          iVar22 = strcmp(pcVar26,"deltaCount");
          if (iVar22 == 0) {
            if (args_info->sequentialProps_group_counter != 0 && (int)uVar24 != 0) {
              args_info->sequentialProps_group_counter = 0;
              args_info->ca1_given = 0;
              args_info->ca2_given = 0;
              args_info->gcn_given = 0;
              args_info->testequi_given = 0;
              args_info->com_given = 0;
              args_info->comvel_given = 0;
              args_info->deltaCount_given = 0;
              args_info->fluxOut_given = 0;
            }
            args_info->sequentialProps_group_counter = args_info->sequentialProps_group_counter + 1;
            iVar6 = 0x2d;
            iVar22 = 0x208370;
            puVar11 = &local_args_info.deltaCount_given;
            puVar13 = &args_info->deltaCount_given;
            in_stack_fffffffffffffb2c = iVar15;
            goto LAB_00126726;
          }
          iVar22 = strcmp(pcVar26,"fluxOut");
          in_stack_fffffffffffffb2c = iVar15;
          if (iVar22 == 0) {
            if (args_info->sequentialProps_group_counter != 0 && (int)uVar24 != 0) {
              args_info->sequentialProps_group_counter = 0;
              args_info->ca1_given = 0;
              args_info->ca2_given = 0;
              args_info->gcn_given = 0;
              args_info->testequi_given = 0;
              args_info->com_given = 0;
              args_info->comvel_given = 0;
              args_info->deltaCount_given = 0;
              args_info->fluxOut_given = 0;
            }
            args_info->sequentialProps_group_counter = args_info->sequentialProps_group_counter + 1;
            iVar6 = 0x2d;
            iVar22 = 0x20758c;
            puVar11 = &local_args_info.fluxOut_given;
            puVar13 = &args_info->fluxOut_given;
            goto LAB_00126726;
          }
          iVar22 = strcmp(pcVar26,"ca1");
          if (iVar22 == 0) {
            if (args_info->sequentialProps_group_counter != 0 && (int)uVar24 != 0) {
              args_info->sequentialProps_group_counter = 0;
              args_info->ca1_given = 0;
              args_info->ca2_given = 0;
              args_info->gcn_given = 0;
              args_info->testequi_given = 0;
              args_info->com_given = 0;
              args_info->comvel_given = 0;
              args_info->deltaCount_given = 0;
              args_info->fluxOut_given = 0;
            }
            args_info->sequentialProps_group_counter = args_info->sequentialProps_group_counter + 1;
            iVar6 = 0x2d;
            iVar22 = 0x207391;
            puVar11 = &local_args_info.ca1_given;
            puVar13 = &args_info->ca1_given;
            goto LAB_00126726;
          }
          iVar22 = strcmp(pcVar26,"ca2");
          if (iVar22 == 0) {
            if (args_info->sequentialProps_group_counter != 0 && (int)uVar24 != 0) {
              args_info->sequentialProps_group_counter = 0;
              args_info->ca1_given = 0;
              args_info->ca2_given = 0;
              args_info->gcn_given = 0;
              args_info->testequi_given = 0;
              args_info->com_given = 0;
              args_info->comvel_given = 0;
              args_info->deltaCount_given = 0;
              args_info->fluxOut_given = 0;
            }
            args_info->sequentialProps_group_counter = args_info->sequentialProps_group_counter + 1;
            iVar6 = 0x2d;
            iVar22 = 0x2074f9;
            puVar11 = &local_args_info.ca2_given;
            puVar13 = &args_info->ca2_given;
            goto LAB_00126726;
          }
          pcVar18 = "gcn";
          iVar22 = strcmp(pcVar26,"gcn");
          pcVar26 = extraout_RDX_07;
          if (iVar22 == 0) {
            if (args_info->sequentialProps_group_counter != 0 && (int)uVar24 != 0) {
              args_info->sequentialProps_group_counter = 0;
              args_info->ca1_given = 0;
              args_info->ca2_given = 0;
              args_info->gcn_given = 0;
              args_info->testequi_given = 0;
              args_info->com_given = 0;
              args_info->comvel_given = 0;
              args_info->deltaCount_given = 0;
              args_info->fluxOut_given = 0;
            }
            args_info->sequentialProps_group_counter = args_info->sequentialProps_group_counter + 1;
            iVar6 = 0x2d;
            iVar22 = 0x20837b;
            puVar11 = &local_args_info.gcn_given;
            puVar13 = &args_info->gcn_given;
            goto LAB_00126726;
          }
        }
        goto LAB_00126781;
      }
      iVar22 = 3;
      goto LAB_00126783;
    }
    iVar6 = (int)uVar24;
    switch(iVar22) {
    case 0x62:
      iVar6 = 0x62;
      iVar22 = 0x208307;
      cVar27 = ARG_INT;
      pcVar26 = "100";
      puVar11 = &local_args_info.nbins_given;
      puVar13 = &args_info->nbins_given;
      pcVar18 = (char *)&args_info->nbins_orig;
      ppcVar10 = (char **)&args_info->nbins_arg;
      goto LAB_0012676f;
    case 99:
      if (args_info->sequentialProps_group_counter != 0 && iVar6 != 0) {
        args_info->sequentialProps_group_counter = 0;
        args_info->ca1_given = 0;
        args_info->ca2_given = 0;
        args_info->gcn_given = 0;
        args_info->testequi_given = 0;
        args_info->com_given = 0;
        args_info->comvel_given = 0;
        args_info->deltaCount_given = 0;
        args_info->fluxOut_given = 0;
      }
      args_info->sequentialProps_group_counter = args_info->sequentialProps_group_counter + 1;
      iVar6 = 99;
      iVar22 = 0x207029;
      puVar11 = &local_args_info.com_given;
      puVar13 = &args_info->com_given;
      goto LAB_00126726;
    case 100:
    case 0x65:
    case 0x66:
    case 0x67:
    case 0x6a:
    case 0x6b:
    case 0x6c:
    case 0x6d:
    case 0x6e:
    case 0x70:
    case 0x71:
    case 0x73:
    case 0x75:
    case 0x77:
      goto switchD_001262e0_caseD_64;
    case 0x68:
      goto switchD_001262e0_caseD_68;
    case 0x69:
      iVar6 = 0x69;
      iVar22 = 0x2082ee;
      puVar11 = &local_args_info.input_given;
      puVar13 = &args_info->input_given;
      pcVar18 = (char *)&args_info->input_orig;
      ppcVar10 = &args_info->input_arg;
      goto LAB_001265f3;
    case 0x6f:
      iVar6 = 0x6f;
      iVar22 = 0x2082f4;
      puVar11 = &local_args_info.output_given;
      puVar13 = &args_info->output_given;
      pcVar18 = (char *)&args_info->output_orig;
      ppcVar10 = &args_info->output_arg;
LAB_001265f3:
      cVar27 = ARG_STRING;
      goto LAB_0012676d;
    case 0x72:
      iVar6 = 0x72;
      iVar22 = 0x208343;
      puVar11 = &local_args_info.dropletR_given;
      puVar13 = &args_info->dropletR_given;
      pcVar18 = (char *)&args_info->dropletR_orig;
      ppcVar10 = (char **)&args_info->dropletR_arg;
      break;
    case 0x74:
      if (args_info->sequentialProps_group_counter != 0 && iVar6 != 0) {
        args_info->sequentialProps_group_counter = 0;
        args_info->ca1_given = 0;
        args_info->ca2_given = 0;
        args_info->gcn_given = 0;
        args_info->testequi_given = 0;
        args_info->com_given = 0;
        args_info->comvel_given = 0;
        args_info->deltaCount_given = 0;
        args_info->fluxOut_given = 0;
      }
      args_info->sequentialProps_group_counter = args_info->sequentialProps_group_counter + 1;
      iVar6 = 0x74;
      iVar22 = 0x20837f;
      puVar11 = &local_args_info.testequi_given;
      puVar13 = &args_info->testequi_given;
      goto LAB_00126726;
    case 0x76:
      if (args_info->sequentialProps_group_counter != 0 && iVar6 != 0) {
        args_info->sequentialProps_group_counter = 0;
        args_info->ca1_given = 0;
        args_info->ca2_given = 0;
        args_info->gcn_given = 0;
        args_info->testequi_given = 0;
        args_info->com_given = 0;
        args_info->comvel_given = 0;
        args_info->deltaCount_given = 0;
        args_info->fluxOut_given = 0;
      }
      args_info->sequentialProps_group_counter = args_info->sequentialProps_group_counter + 1;
      iVar6 = 0x76;
      iVar22 = 0x208369;
      puVar11 = &local_args_info.comvel_given;
      puVar13 = &args_info->comvel_given;
LAB_00126726:
      ppcVar10 = (char **)0x0;
      pcVar18 = (char *)0x0;
      cVar27 = ARG_NO;
      goto LAB_0012676d;
    case 0x78:
      iVar6 = 0x78;
      iVar22 = 0x208324;
      puVar11 = &local_args_info.centroidX_given;
      puVar13 = &args_info->centroidX_given;
      pcVar18 = (char *)&args_info->centroidX_orig;
      ppcVar10 = (char **)&args_info->centroidX_arg;
      break;
    case 0x79:
      iVar6 = 0x79;
      iVar22 = 0x20832e;
      puVar11 = &local_args_info.centroidY_given;
      puVar13 = &args_info->centroidY_given;
      pcVar18 = (char *)&args_info->centroidY_orig;
      ppcVar10 = (char **)&args_info->centroidY_arg;
      break;
    case 0x7a:
      iVar6 = 0x7a;
      iVar22 = 0x208338;
      puVar11 = &local_args_info.referenceZ_given;
      puVar13 = &args_info->referenceZ_given;
      pcVar18 = (char *)&args_info->referenceZ_orig;
      ppcVar10 = (char **)&args_info->referenceZ_arg;
      break;
    default:
      if (iVar22 == 0x56) {
        cmdline_parser_print_version();
        goto LAB_00126dd6;
      }
      goto switchD_001262e0_caseD_64;
    }
    cVar27 = ARG_DOUBLE;
LAB_0012676d:
    pcVar26 = (char *)0x0;
LAB_0012676f:
    iVar6 = update_arg(ppcVar10,(char **)pcVar18,puVar13,puVar11,(char *)pcVar21,(char **)0x0,
                       pcVar26,cVar27,check_ambiguity,(int)uVar24,iVar22,iVar6,
                       in_stack_fffffffffffffb18,(char)uVar24,
                       (char *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28));
    iVar22 = 5;
    pcVar26 = extraout_RDX_08;
    if (iVar6 == 0) {
LAB_00126781:
      iVar22 = 0;
    }
LAB_00126783:
    if (iVar22 != 0) {
      if (iVar22 == 5) {
        cmdline_parser_release(&local_args_info);
        iVar7 = 1;
      }
      else {
        uVar23 = args_info->sequentialProps_group_counter;
        if (1 < (int)uVar23) {
          fprintf(_stderr,"%s: %d options of group sequentialProps were given. One is required%s.\n"
                  ,*argv,(ulong)uVar23,"");
          pcVar26 = extraout_RDX_17;
        }
        uVar23 = (uint)(1 < (int)uVar23);
        if (iVar7 != 0) {
          iVar7 = cmdline_parser_required2(args_info,*argv,pcVar26);
          uVar23 = uVar23 + iVar7;
        }
        cmdline_parser_release(&local_args_info);
        iVar7 = 1;
        if (uVar23 == 0) {
          iVar7 = 0;
          uVar23 = argc - iVar16;
          if (uVar23 != 0 && iVar16 <= argc) {
            args_info->inputs_num = uVar23;
            ppcVar10 = (char **)malloc((ulong)uVar23 * 8);
            args_info->inputs = ppcVar10;
            iVar7 = 0;
            uVar24 = 0;
            do {
              pcVar18 = gengetopt_strdup(argv[(long)iVar16 + uVar24]);
              args_info->inputs[uVar24] = pcVar18;
              uVar24 = uVar24 + 1;
            } while (uVar23 != uVar24);
          }
        }
      }
      return iVar7;
    }
  } while( true );
switchD_001262e0_caseD_64:
  cmdline_parser_internal();
switchD_001262e0_caseD_68:
  cmdline_parser_print_help();
LAB_00126dd6:
  cmdline_parser_free(&local_args_info);
  exit(0);
}

Assistant:

int
cmdline_parser_internal (
  int argc, char **argv, struct gengetopt_args_info *args_info,
                        struct cmdline_parser_params *params, const char *additional_error)
{
  int c;	/* Character of the parsed option.  */

  int error_occurred = 0;
  struct gengetopt_args_info local_args_info;
  
  int override;
  int initialize;
  int check_required;
  int check_ambiguity;

  char *optarg;
  int optind;
  int opterr;
  int optopt;
  
  package_name = argv[0];
  
  /* TODO: Why is this here? It is not used anywhere. */
  override = params->override;
  FIX_UNUSED(override);

  initialize = params->initialize;
  check_required = params->check_required;

  /* TODO: Why is this here? It is not used anywhere. */
  check_ambiguity = params->check_ambiguity;
  FIX_UNUSED(check_ambiguity);

  if (initialize)
    cmdline_parser_init (args_info);

  cmdline_parser_init (&local_args_info);

  optarg = 0;
  optind = 0;
  opterr = params->print_errors;
  optopt = '?';

  while (1)
    {
      int option_index = 0;

      static struct option long_options[] = {
        { "help",	0, NULL, 'h' },
        { "version",	0, NULL, 'V' },
        { "input",	1, NULL, 'i' },
        { "output",	1, NULL, 'o' },
        { "sele1",	1, NULL, 0 },
        { "sele2",	1, NULL, 0 },
        { "nbins",	1, NULL, 'b' },
        { "nbins_z",	1, NULL, 0 },
        { "privilegedAxis",	1, NULL, 0 },
        { "centroidX",	1, NULL, 'x' },
        { "centroidY",	1, NULL, 'y' },
        { "referenceZ",	1, NULL, 'z' },
        { "dropletR",	1, NULL, 'r' },
        { "threshDens",	1, NULL, 0 },
        { "bufferLength",	1, NULL, 0 },
        { "rcut",	1, NULL, 0 },
        { "com",	0, NULL, 'c' },
        { "comvel",	0, NULL, 'v' },
        { "deltaCount",	0, NULL, 0 },
        { "fluxOut",	0, NULL, 0 },
        { "ca1",	0, NULL, 0 },
        { "ca2",	0, NULL, 0 },
        { "gcn",	0, NULL, 0 },
        { "testequi",	0, NULL, 't' },
        { 0,  0, 0, 0 }
      };

      custom_optarg = optarg;
      custom_optind = optind;
      custom_opterr = opterr;
      custom_optopt = optopt;

      c = custom_getopt_long (argc, argv, "hVi:o:b:x:y:z:r:cvt", long_options, &option_index);

      optarg = custom_optarg;
      optind = custom_optind;
      opterr = custom_opterr;
      optopt = custom_optopt;

      if (c == -1) break;	/* Exit from `while (1)' loop.  */

      switch (c)
        {
        case 'h':	/* Print help and exit.  */
          cmdline_parser_print_help ();
          cmdline_parser_free (&local_args_info);
          exit (EXIT_SUCCESS);

        case 'V':	/* Print version and exit.  */
          cmdline_parser_print_version ();
          cmdline_parser_free (&local_args_info);
          exit (EXIT_SUCCESS);

        case 'i':	/* input dump file.  */
        
        
          if (update_arg( (void *)&(args_info->input_arg), 
               &(args_info->input_orig), &(args_info->input_given),
              &(local_args_info.input_given), optarg, 0, 0, ARG_STRING,
              check_ambiguity, override, 0, 0,
              "input", 'i',
              additional_error))
            goto failure;
        
          break;
        case 'o':	/* output file name.  */
        
        
          if (update_arg( (void *)&(args_info->output_arg), 
               &(args_info->output_orig), &(args_info->output_given),
              &(local_args_info.output_given), optarg, 0, 0, ARG_STRING,
              check_ambiguity, override, 0, 0,
              "output", 'o',
              additional_error))
            goto failure;
        
          break;
        case 'b':	/* number of bins (general purpose).  */
        
        
          if (update_arg( (void *)&(args_info->nbins_arg), 
               &(args_info->nbins_orig), &(args_info->nbins_given),
              &(local_args_info.nbins_given), optarg, 0, "100", ARG_INT,
              check_ambiguity, override, 0, 0,
              "nbins", 'b',
              additional_error))
            goto failure;
        
          break;
        case 'x':	/* Location of droplet centroid in x.  */
        
        
          if (update_arg( (void *)&(args_info->centroidX_arg), 
               &(args_info->centroidX_orig), &(args_info->centroidX_given),
              &(local_args_info.centroidX_given), optarg, 0, 0, ARG_DOUBLE,
              check_ambiguity, override, 0, 0,
              "centroidX", 'x',
              additional_error))
            goto failure;
        
          break;
        case 'y':	/* Location of droplet centroid in y.  */
        
        
          if (update_arg( (void *)&(args_info->centroidY_arg), 
               &(args_info->centroidY_orig), &(args_info->centroidY_given),
              &(local_args_info.centroidY_given), optarg, 0, 0, ARG_DOUBLE,
              check_ambiguity, override, 0, 0,
              "centroidY", 'y',
              additional_error))
            goto failure;
        
          break;
        case 'z':	/* Reference z-height of solid surface.  */
        
        
          if (update_arg( (void *)&(args_info->referenceZ_arg), 
               &(args_info->referenceZ_orig), &(args_info->referenceZ_given),
              &(local_args_info.referenceZ_given), optarg, 0, 0, ARG_DOUBLE,
              check_ambiguity, override, 0, 0,
              "referenceZ", 'z',
              additional_error))
            goto failure;
        
          break;
        case 'r':	/* Droplet radius in angstroms.  */
        
        
          if (update_arg( (void *)&(args_info->dropletR_arg), 
               &(args_info->dropletR_orig), &(args_info->dropletR_given),
              &(local_args_info.dropletR_given), optarg, 0, 0, ARG_DOUBLE,
              check_ambiguity, override, 0, 0,
              "dropletR", 'r',
              additional_error))
            goto failure;
        
          break;
        case 'c':	/* selection center of mass.  */
        
          if (args_info->sequentialProps_group_counter && override)
            reset_group_sequentialProps (args_info);
          args_info->sequentialProps_group_counter += 1;
        
          if (update_arg( 0 , 
               0 , &(args_info->com_given),
              &(local_args_info.com_given), optarg, 0, 0, ARG_NO,
              check_ambiguity, override, 0, 0,
              "com", 'c',
              additional_error))
            goto failure;
        
          break;
        case 'v':	/* selection center of mass velocity.  */
        
          if (args_info->sequentialProps_group_counter && override)
            reset_group_sequentialProps (args_info);
          args_info->sequentialProps_group_counter += 1;
        
          if (update_arg( 0 , 
               0 , &(args_info->comvel_given),
              &(local_args_info.comvel_given), optarg, 0, 0, ARG_NO,
              check_ambiguity, override, 0, 0,
              "comvel", 'v',
              additional_error))
            goto failure;
        
          break;
        case 't':	/* Temperature using all componets of linear and angular momentum.  */
        
          if (args_info->sequentialProps_group_counter && override)
            reset_group_sequentialProps (args_info);
          args_info->sequentialProps_group_counter += 1;
        
          if (update_arg( 0 , 
               0 , &(args_info->testequi_given),
              &(local_args_info.testequi_given), optarg, 0, 0, ARG_NO,
              check_ambiguity, override, 0, 0,
              "testequi", 't',
              additional_error))
            goto failure;
        
          break;

        case 0:	/* Long option with no short option */
          /* select first stuntdouble set.  */
          if (strcmp (long_options[option_index].name, "sele1") == 0)
          {
          
          
            if (update_arg( (void *)&(args_info->sele1_arg), 
                 &(args_info->sele1_orig), &(args_info->sele1_given),
                &(local_args_info.sele1_given), optarg, 0, 0, ARG_STRING,
                check_ambiguity, override, 0, 0,
                "sele1", '-',
                additional_error))
              goto failure;
          
          }
          /* select second stuntdouble set (if sele2 is not set, use script from sele1).  */
          else if (strcmp (long_options[option_index].name, "sele2") == 0)
          {
          
          
            if (update_arg( (void *)&(args_info->sele2_arg), 
                 &(args_info->sele2_orig), &(args_info->sele2_given),
                &(local_args_info.sele2_given), optarg, 0, 0, ARG_STRING,
                check_ambiguity, override, 0, 0,
                "sele2", '-',
                additional_error))
              goto failure;
          
          }
          /* number of bins in z axis.  */
          else if (strcmp (long_options[option_index].name, "nbins_z") == 0)
          {
          
          
            if (update_arg( (void *)&(args_info->nbins_z_arg), 
                 &(args_info->nbins_z_orig), &(args_info->nbins_z_given),
                &(local_args_info.nbins_z_given), optarg, 0, "100", ARG_INT,
                check_ambiguity, override, 0, 0,
                "nbins_z", '-',
                additional_error))
              goto failure;
          
          }
          /* which axis is special for spatial analysis (default = z axis).  */
          else if (strcmp (long_options[option_index].name, "privilegedAxis") == 0)
          {
          
          
            if (update_arg( (void *)&(args_info->privilegedAxis_arg), 
                 &(args_info->privilegedAxis_orig), &(args_info->privilegedAxis_given),
                &(local_args_info.privilegedAxis_given), optarg, cmdline_parser_privilegedAxis_values, "z", ARG_ENUM,
                check_ambiguity, override, 0, 0,
                "privilegedAxis", '-',
                additional_error))
              goto failure;
          
          }
          /* Threshold Density in g/cm^3.  */
          else if (strcmp (long_options[option_index].name, "threshDens") == 0)
          {
          
          
            if (update_arg( (void *)&(args_info->threshDens_arg), 
                 &(args_info->threshDens_orig), &(args_info->threshDens_given),
                &(local_args_info.threshDens_given), optarg, 0, 0, ARG_DOUBLE,
                check_ambiguity, override, 0, 0,
                "threshDens", '-',
                additional_error))
              goto failure;
          
          }
          /* Buffer length in angstroms.  */
          else if (strcmp (long_options[option_index].name, "bufferLength") == 0)
          {
          
          
            if (update_arg( (void *)&(args_info->bufferLength_arg), 
                 &(args_info->bufferLength_orig), &(args_info->bufferLength_given),
                &(local_args_info.bufferLength_given), optarg, 0, 0, ARG_DOUBLE,
                check_ambiguity, override, 0, 0,
                "bufferLength", '-',
                additional_error))
              goto failure;
          
          }
          /* cutoff radius (rcut).  */
          else if (strcmp (long_options[option_index].name, "rcut") == 0)
          {
          
          
            if (update_arg( (void *)&(args_info->rcut_arg), 
                 &(args_info->rcut_orig), &(args_info->rcut_given),
                &(local_args_info.rcut_given), optarg, 0, 0, ARG_DOUBLE,
                check_ambiguity, override, 0, 0,
                "rcut", '-',
                additional_error))
              goto failure;
          
          }
          /* difference in counts between two selections.  */
          else if (strcmp (long_options[option_index].name, "deltaCount") == 0)
          {
          
            if (args_info->sequentialProps_group_counter && override)
              reset_group_sequentialProps (args_info);
            args_info->sequentialProps_group_counter += 1;
          
            if (update_arg( 0 , 
                 0 , &(args_info->deltaCount_given),
                &(local_args_info.deltaCount_given), optarg, 0, 0, ARG_NO,
                check_ambiguity, override, 0, 0,
                "deltaCount", '-',
                additional_error))
              goto failure;
          
          }
          /* number flux out of a selection.  */
          else if (strcmp (long_options[option_index].name, "fluxOut") == 0)
          {
          
            if (args_info->sequentialProps_group_counter && override)
              reset_group_sequentialProps (args_info);
            args_info->sequentialProps_group_counter += 1;
          
            if (update_arg( 0 , 
                 0 , &(args_info->fluxOut_given),
                &(local_args_info.fluxOut_given), optarg, 0, 0, ARG_NO,
                check_ambiguity, override, 0, 0,
                "fluxOut", '-',
                additional_error))
              goto failure;
          
          }
          /* contact angle of selection (using center of mass).  */
          else if (strcmp (long_options[option_index].name, "ca1") == 0)
          {
          
            if (args_info->sequentialProps_group_counter && override)
              reset_group_sequentialProps (args_info);
            args_info->sequentialProps_group_counter += 1;
          
            if (update_arg( 0 , 
                 0 , &(args_info->ca1_given),
                &(local_args_info.ca1_given), optarg, 0, 0, ARG_NO,
                check_ambiguity, override, 0, 0,
                "ca1", '-',
                additional_error))
              goto failure;
          
          }
          /* contact angle of selection (using density profile).  */
          else if (strcmp (long_options[option_index].name, "ca2") == 0)
          {
          
            if (args_info->sequentialProps_group_counter && override)
              reset_group_sequentialProps (args_info);
            args_info->sequentialProps_group_counter += 1;
          
            if (update_arg( 0 , 
                 0 , &(args_info->ca2_given),
                &(local_args_info.ca2_given), optarg, 0, 0, ARG_NO,
                check_ambiguity, override, 0, 0,
                "ca2", '-',
                additional_error))
              goto failure;
          
          }
          /* Generalized Coordinate Number.  */
          else if (strcmp (long_options[option_index].name, "gcn") == 0)
          {
          
            if (args_info->sequentialProps_group_counter && override)
              reset_group_sequentialProps (args_info);
            args_info->sequentialProps_group_counter += 1;
          
            if (update_arg( 0 , 
                 0 , &(args_info->gcn_given),
                &(local_args_info.gcn_given), optarg, 0, 0, ARG_NO,
                check_ambiguity, override, 0, 0,
                "gcn", '-',
                additional_error))
              goto failure;
          
          }
          
          break;
        case '?':	/* Invalid option.  */
          /* `getopt_long' already printed an error message.  */
          goto failure;

        default:	/* bug: option not considered.  */
          fprintf (stderr, "%s: option unknown: %c%s\n", CMDLINE_PARSER_PACKAGE, c, (additional_error ? additional_error : ""));
          abort ();
        } /* switch */
    } /* while */

  if (args_info->sequentialProps_group_counter > 1)
    {
      fprintf (stderr, "%s: %d options of group sequentialProps were given. One is required%s.\n", argv[0], args_info->sequentialProps_group_counter, (additional_error ? additional_error : ""));
      error_occurred = 1;
    }
  


  if (check_required)
    {
      error_occurred += cmdline_parser_required2 (args_info, argv[0], additional_error);
    }

  cmdline_parser_release (&local_args_info);

  if ( error_occurred )
    return (EXIT_FAILURE);

  if (optind < argc)
    {
      int i = 0 ;
      int found_prog_name = 0;
      /* whether program name, i.e., argv[0], is in the remaining args
         (this may happen with some implementations of getopt,
          but surely not with the one included by gengetopt) */


      args_info->inputs_num = argc - optind - found_prog_name;
      args_info->inputs =
        (char **)(malloc ((args_info->inputs_num)*sizeof(char *))) ;
      while (optind < argc)
        args_info->inputs[ i++ ] = gengetopt_strdup (argv[optind++]) ;
    }

  return 0;

failure:
  
  cmdline_parser_release (&local_args_info);
  return (EXIT_FAILURE);
}